

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

ssize_t __thiscall
acto::core::runtime_t::send(runtime_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  object_t *sender;
  bool bVar1;
  undefined8 *puVar2;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  __uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> local_20;
  
  puVar2 = (undefined8 *)(anonymous)::thread_context();
  sender = (object_t *)*puVar2;
  local_20._M_t.super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>
  .super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl = *__buf;
  *(undefined8 *)__buf = 0;
  bVar1 = send_on_behalf(this,(object_t *)CONCAT44(in_register_00000034,__fd),sender,
                         (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)
                         &local_20);
  if ((_Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>)
      local_20._M_t.
      super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
      super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl != (msg_t *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>
                          .super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl + 8))();
  }
  return CONCAT71(extraout_var,bVar1) & 0xffffffff;
}

Assistant:

bool runtime_t::send(object_t* const target, std::unique_ptr<msg_t> msg) {
  return send_on_behalf(target, thread_context.active_actor, std::move(msg));
}